

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

optional<unsigned_long> ToIntegral<unsigned_long>(string_view str)

{
  optional<unsigned_long> *this;
  const_pointer pvVar1;
  const_pointer pvVar2;
  size_type sVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  char *in_RDI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_long> _Var5;
  optional<unsigned_long> oVar6;
  char *first_nonmatching;
  unsigned_long result;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  unsigned_long *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  int __base;
  unsigned_long *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  _Storage<unsigned_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  __base = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::data
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  this = (optional<unsigned_long> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  _Var5 = std::from_chars<unsigned_long>
                    (in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__base);
  pvVar1 = _Var5.ptr;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if ((pvVar1 == pvVar2 + sVar3) && (_Var5.ec == 0)) {
    std::optional<unsigned_long>::optional<unsigned_long,_true>(this,in_stack_ffffffffffffff90);
    uVar4 = extraout_RDX_00;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_18);
    uVar4 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
    oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_10;
    oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_18._M_value;
    return (optional<unsigned_long>)
           oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<T> ToIntegral(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    const auto [first_nonmatching, error_condition] = std::from_chars(str.data(), str.data() + str.size(), result);
    if (first_nonmatching != str.data() + str.size() || error_condition != std::errc{}) {
        return std::nullopt;
    }
    return result;
}